

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputCb(int *pRc,Fts5Iter *pIter)

{
  long lVar1;
  long in_RSI;
  int *in_RDI;
  Fts5Config *pConfig;
  
  if (*in_RDI == 0) {
    lVar1 = **(long **)(in_RSI + 0x20);
    if (*(int *)(lVar1 + 0x74) == 1) {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_None;
    }
    else if (*(long *)(in_RSI + 0x38) == 0) {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_Nocolset;
    }
    else if (**(int **)(in_RSI + 0x38) == 0) {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_ZeroColset;
    }
    else if (*(int *)(lVar1 + 0x74) == 0) {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_Full;
    }
    else if (*(int *)(lVar1 + 0x20) < 0x65) {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_Col100;
      sqlite3Fts5BufferSize((int *)pIter,(Fts5Buffer *)pConfig,(u32)((ulong)in_RDI >> 0x20));
    }
    else {
      *(code **)(in_RSI + 0x40) = fts5IterSetOutputs_Col;
    }
  }
  return;
}

Assistant:

static void fts5IterSetOutputCb(int *pRc, Fts5Iter *pIter){
  assert( pIter!=0 || (*pRc)!=SQLITE_OK );
  if( *pRc==SQLITE_OK ){
    Fts5Config *pConfig = pIter->pIndex->pConfig;
    if( pConfig->eDetail==FTS5_DETAIL_NONE ){
      pIter->xSetOutputs = fts5IterSetOutputs_None;
    }

    else if( pIter->pColset==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_Nocolset;
    }

    else if( pIter->pColset->nCol==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_ZeroColset;
    }

    else if( pConfig->eDetail==FTS5_DETAIL_FULL ){
      pIter->xSetOutputs = fts5IterSetOutputs_Full;
    }

    else{
      assert( pConfig->eDetail==FTS5_DETAIL_COLUMNS );
      if( pConfig->nCol<=100 ){
        pIter->xSetOutputs = fts5IterSetOutputs_Col100;
        sqlite3Fts5BufferSize(pRc, &pIter->poslist, pConfig->nCol);
      }else{
        pIter->xSetOutputs = fts5IterSetOutputs_Col;
      }
    }
  }
}